

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O2

QSize __thiscall QAbstractScrollArea::viewportSizeHint(QAbstractScrollArea *this)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long **)(*(long *)(this + 8) + 0x2b0) != (long *)0x0) {
    uVar2 = (**(code **)(**(long **)(*(long *)(this + 8) + 0x2b0) + 0x70))();
    if ((uVar2 & 0x8000000080000000) == 0) {
      uVar4 = uVar2 >> 0x20;
      goto LAB_0037055f;
    }
  }
  QWidget::fontMetrics((QWidget *)&stack0xffffffffffffffe0);
  iVar1 = QFontMetrics::height();
  iVar3 = 10;
  if (10 < iVar1) {
    iVar3 = iVar1;
  }
  QFontMetrics::~QFontMetrics((QFontMetrics *)&stack0xffffffffffffffe0);
  uVar2 = (ulong)(uint)(iVar3 * 6);
  uVar4 = (ulong)(uint)(iVar3 << 2);
LAB_0037055f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QSize)(uVar2 & 0xffffffff | uVar4 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QAbstractScrollArea::viewportSizeHint() const
{
    Q_D(const QAbstractScrollArea);
    if (d->viewport) {
        const QSize sh = d->viewport->sizeHint();
        if (sh.isValid()) {
            return sh;
        }
    }
    const int h = qMax(10, fontMetrics().height());
    return QSize(6 * h, 4 * h);
}